

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

FuncInfo * ByteCodeGenerator::GetParentFuncInfo(FuncInfo *child)

{
  code *pcVar1;
  bool bVar2;
  FuncInfo *in_RAX;
  undefined4 *puVar3;
  Scope *pSVar4;
  
  pSVar4 = (Scope *)&child->bodyScope;
  do {
    pSVar4 = pSVar4->enclosingScope;
    if (pSVar4 == (Scope *)0x0) break;
    in_RAX = pSVar4->func;
  } while (in_RAX == child);
  if (pSVar4 == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x73e,"(0)","0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    in_RAX = (FuncInfo *)0x0;
  }
  return in_RAX;
}

Assistant:

FuncInfo* ByteCodeGenerator::GetParentFuncInfo(FuncInfo* child)
{
    for (Scope* scope = child->GetBodyScope(); scope; scope = scope->GetEnclosingScope())
    {
        if (scope->GetFunc() != child)
        {
            return scope->GetFunc();
        }
    }
    Assert(0);
    return nullptr;
}